

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * mg_strndup_ctx(char *ptr,size_t len,mg_context *ctx)

{
  char *dst;
  
  dst = (char *)malloc(len + 1);
  if (dst != (char *)0x0) {
    mg_strlcpy(dst,ptr,len + 1);
  }
  return dst;
}

Assistant:

static char *
mg_strndup_ctx(const char *ptr, size_t len, struct mg_context *ctx)
{
	char *p;
	(void)ctx; /* Avoid Visual Studio warning if USE_SERVER_STATS is not
	            * defined */

	if ((p = (char *)mg_malloc_ctx(len + 1, ctx)) != NULL) {
		mg_strlcpy(p, ptr, len + 1);
	}

	return p;
}